

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

Pattern * __thiscall
trieste::
T<trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef>
          (Pattern *__return_storage_ptr__,trieste *this,Token *type1,Token *type2,TokenDef *types,
          TokenDef *types_1,TokenDef *types_2,TokenDef *types_3,TokenDef *types_4,TokenDef *types_5,
          TokenDef *types_6,TokenDef *types_7,TokenDef *types_8,TokenDef *types_9,TokenDef *types_10
          )

{
  Pattern *pPVar1;
  initializer_list<trieste::Token> __l;
  initializer_list<trieste::Token> __l_00;
  allocator_type local_17a;
  less<trieste::Token> local_179;
  undefined1 local_178 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_160 [2];
  Pattern *local_150;
  vector<trieste::Token,_std::allocator<trieste::Token>_> types_;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_130;
  FastPattern local_100;
  Token local_98;
  TokenDef *local_90;
  Token *local_88;
  TokenDef *local_80;
  TokenDef *local_78;
  TokenDef *local_70;
  TokenDef *local_68;
  TokenDef *local_60;
  TokenDef *local_58;
  TokenDef *local_50;
  TokenDef *local_48;
  TokenDef *local_40;
  TokenDef *local_38;
  
  local_98.def = *(TokenDef **)this;
  local_90 = type1->def;
  local_70 = types_2;
  local_68 = types_3;
  local_60 = types_4;
  local_58 = types_5;
  local_50 = types_6;
  local_48 = types_7;
  local_40 = types_8;
  local_38 = types_9;
  __l._M_len = 0xd;
  __l._M_array = &local_98;
  local_150 = __return_storage_ptr__;
  local_88 = type2;
  local_80 = types;
  local_78 = types_1;
  std::vector<trieste::Token,_std::allocator<trieste::Token>_>::vector
            (&types_,__l,(allocator_type *)local_178);
  std::
  make_shared<trieste::detail::TokenMatch,std::vector<trieste::Token,std::allocator<trieste::Token>>&>
            ((vector<trieste::Token,_std::allocator<trieste::Token>_> *)local_178);
  local_178._16_8_ = local_178._0_8_;
  a_Stack_160[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_;
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = (pointer)0x0;
  local_98.def = *(TokenDef **)this;
  local_90 = type1->def;
  local_70 = types_2;
  local_68 = types_3;
  local_60 = types_4;
  local_58 = types_5;
  local_50 = types_6;
  local_48 = types_7;
  local_40 = types_8;
  local_38 = types_9;
  __l_00._M_len = 0xd;
  __l_00._M_array = &local_98;
  local_88 = type2;
  local_80 = types;
  local_78 = types_1;
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            (&local_130,__l_00,&local_179,&local_17a);
  detail::FastPattern::match_token(&local_100,&local_130);
  pPVar1 = local_150;
  detail::Pattern::Pattern(local_150,(PatternPtr *)(local_178 + 0x10),&local_100);
  detail::FastPattern::~FastPattern(&local_100);
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_178 + 8));
  std::_Vector_base<trieste::Token,_std::allocator<trieste::Token>_>::~_Vector_base
            (&types_.super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>);
  return pPVar1;
}

Assistant:

inline detail::Pattern
  T(const Token& type1, const Token& type2, const Ts&... types)
  {
    std::vector<Token> types_ = {type1, type2, types...};
    return detail::Pattern(
      std::make_shared<detail::TokenMatch>(types_),
      detail::FastPattern::match_token({type1, type2, types...}));
  }